

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O3

int Js::GetStackSizeForAsmJsUnboxing(ScriptFunction *func)

{
  ScriptContext *scriptContext;
  uint uVar1;
  FunctionBody *this;
  void *pvVar2;
  uint uVar3;
  
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  pvVar2 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo);
  uVar1 = *(ushort *)((long)pvVar2 + 0x80) + 0x17 & 0xfffffff0;
  uVar3 = 0x20;
  if (0x20 < uVar1) {
    uVar3 = uVar1;
  }
  scriptContext =
       (((((func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack
            (scriptContext->threadContext,(ulong)(uVar3 + 0xc00),(RecyclableObject *)func,
             scriptContext);
  return uVar3;
}

Assistant:

int GetStackSizeForAsmJsUnboxing(ScriptFunction* func)
    {
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        int argSize = info->GetArgByteSize() + MachPtr;
        argSize = ::Math::Align<int32>(argSize, 16);

        if (argSize < 32)
        {
            argSize = 32; // convention is to always allocate spill space for rcx,rdx,r8,r9
        }

        PROBE_STACK_CALL(func->GetScriptContext(), func, argSize + Js::Constants::MinStackDefault);
        return argSize;
    }